

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::~parallel_hash_set
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *this)

{
  Inner *pIVar1;
  slot_type **ppsVar2;
  size_t sVar3;
  size_t i;
  size_t sVar4;
  Inner *pIVar5;
  tuple<unsigned_long,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  *alloc;
  long lVar6;
  Layout LVar7;
  
  pIVar5 = (Inner *)(this + 1);
  do {
    pIVar1 = (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                *)((long)pIVar5 + -0x300))->sets_)._M_elems + 0xf;
    sVar3 = (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               *)((long)pIVar5 + -0x300))->sets_)._M_elems[0xf].set_.capacity_;
    if (sVar3 != 0) {
      ppsVar2 = &(((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                    *)((long)pIVar5 + -0x300))->sets_)._M_elems[0xf].set_.slots_;
      lVar6 = 0;
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        if (-1 < (pIVar1->set_).ctrl_[sVar4]) {
          std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
                    ((unique_ptr<int,_std::default_delete<int>_> *)
                     ((long)&((*ppsVar2)->_M_t).
                             super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                             super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl + lVar6));
        }
        lVar6 = lVar6 + 8;
      }
      LVar7 = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
              ::MakeLayout((((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                              *)((long)pIVar5 + -0x300))->sets_)._M_elems[0xf].set_.capacity_);
      alloc = &(((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                  *)((long)pIVar5 + -0x300))->sets_)._M_elems[0xf].set_.settings_;
      Deallocate<8ul,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                ((allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *)alloc,
                 (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                    *)((long)pIVar5 + -0x300))->sets_)._M_elems[0xf].set_.ctrl_,
                 (LVar7.super_LayoutType<sizeof___(Ts),_signed_char,_std::unique_ptr<int>_>.size_[0]
                  + 7 & 0xfffffffffffffff8) +
                 LVar7.super_LayoutType<sizeof___(Ts),_signed_char,_std::unique_ptr<int>_>.size_[1]
                 * 8);
      (pIVar1->set_).ctrl_ =
           EmptyGroup<std::is_same<std::allocator<std::unique_ptr<int,std::default_delete<int>>>,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>>()
           ::empty_group;
      (alloc->
      super__Tuple_impl<0UL,_unsigned_long,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
      *ppsVar2 = (slot_type *)0x0;
      (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         *)((long)pIVar5 + -0x300))->sets_)._M_elems[0xf].set_.size_ = 0;
      (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         *)((long)pIVar5 + -0x300))->sets_)._M_elems[0xf].set_.capacity_ = 0;
    }
    pIVar5 = pIVar1;
  } while ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            *)pIVar1 != this);
  return;
}

Assistant:

~parallel_hash_set() {}